

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::read_symlink(path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  error_code *in_RDX;
  error_code *in_RDI;
  error_code eVar3;
  path result;
  error_code *in_stack_00000050;
  file_status fs;
  error_code *this;
  path *in_stack_ffffffffffffff98;
  undefined4 uStack_2c;
  file_status local_20;
  error_code *local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  symlink_status(in_stack_ffffffffffffff98,in_RDI);
  fVar2 = file_status::type(&local_20);
  if (fVar2 == symlink) {
    detail::resolveSymlink((path *)fs,in_stack_00000050);
    bVar1 = std::error_code::operator_cast_to_bool(local_18);
    if (bVar1) {
      path::path((path *)0x1315c0);
    }
    else {
      path::path((path *)this,(path *)in_RDI);
    }
    path::~path((path *)0x1315e6);
  }
  else {
    eVar3 = detail::make_error_code((portable_error)((ulong)this >> 0x20));
    *(ulong *)local_18 = CONCAT44(uStack_2c,eVar3._M_value);
    local_18->_M_cat = eVar3._M_cat;
    path::path((path *)0x131584);
  }
  file_status::~file_status(&local_20);
  return (path *)this;
}

Assistant:

GHC_INLINE path read_symlink(const path& p, std::error_code& ec)
{
    file_status fs = symlink_status(p, ec);
    if (fs.type() != file_type::symlink) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return path();
    }
    auto result = detail::resolveSymlink(p, ec);
    return ec ? path() : result;
}